

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O0

void __thiscall cmTryRunCommand::RunExecutable(cmTryRunCommand *this,string *runArgs,string *out)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  reference pbVar4;
  undefined1 auVar5 [16];
  char local_508 [8];
  char retChar [1000];
  undefined1 local_118 [3];
  bool worked;
  int timeout;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  const_iterator ei;
  undefined1 local_b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  string emulator;
  string finalCommand;
  int retVal;
  string *out_local;
  string *runArgs_local;
  cmTryRunCommand *this_local;
  
  finalCommand.field_2._12_4_ = 0xffffffff;
  std::__cxx11::string::string((string *)(emulator.field_2._M_local_buf + 8));
  this_00 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"CMAKE_CROSSCOMPILING_EMULATOR",&local_89);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,pcVar2,
             (allocator *)
             ((long)&emulatorWithArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&emulatorWithArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8);
    cmSystemTools::ExpandListArgument
              ((string *)local_68,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b8,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8,0);
    auVar5 = std::__cxx11::string::c_str();
    cmSystemTools::ConvertToRunCommandPath_abi_cxx11_((string *)&ei,auVar5._0_8_,auVar5._8_8_);
    std::__cxx11::string::operator+=((string *)(emulator.field_2._M_local_buf + 8),(string *)&ei);
    std::__cxx11::string::~string((string *)&ei);
    std::__cxx11::string::operator+=((string *)(emulator.field_2._M_local_buf + 8)," ");
    local_f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8);
    local_e8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator+(&local_f0,1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_e0,&local_e8);
    while( true ) {
      local_f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b8);
      bVar1 = __gnu_cxx::operator!=(&local_e0,&local_f8);
      if (!bVar1) break;
      std::__cxx11::string::operator+=((string *)(emulator.field_2._M_local_buf + 8),"\"");
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_e0);
      std::__cxx11::string::operator+=
                ((string *)(emulator.field_2._M_local_buf + 8),(string *)pbVar4);
      std::__cxx11::string::operator+=((string *)(emulator.field_2._M_local_buf + 8),"\"");
      std::__cxx11::string::operator+=((string *)(emulator.field_2._M_local_buf + 8)," ");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_e0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  }
  auVar5 = std::__cxx11::string::c_str();
  cmSystemTools::ConvertToRunCommandPath_abi_cxx11_((string *)local_118,auVar5._0_8_,auVar5._8_8_);
  std::__cxx11::string::operator+=
            ((string *)(emulator.field_2._M_local_buf + 8),(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)(emulator.field_2._M_local_buf + 8),(string *)runArgs);
  }
  retChar[0x3e4] = '\0';
  retChar[0x3e5] = '\0';
  retChar[0x3e6] = '\0';
  retChar[999] = '\0';
  pcVar2 = (char *)std::__cxx11::string::c_str();
  retChar[0x3e3] =
       cmSystemTools::RunSingleCommand
                 (pcVar2,out,out,(int *)(finalCommand.field_2._M_local_buf + 0xc),(char *)0x0,
                  OUTPUT_NONE,(double)(int)retChar._996_4_);
  if ((bool)retChar[0x3e3]) {
    sprintf(local_508,"%i",(ulong)(uint)finalCommand.field_2._12_4_);
  }
  else {
    strcpy(local_508,"FAILED_TO_RUN");
  }
  cmMakefile::AddCacheDefinition
            ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,&this->RunResultVariable,
             local_508,"Result of TRY_RUN",INTERNAL,false);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(emulator.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmTryRunCommand::RunExecutable(const std::string& runArgs,
                                    std::string* out)
{
  int retVal = -1;

  std::string finalCommand;
  const std::string emulator =
    this->Makefile->GetSafeDefinition("CMAKE_CROSSCOMPILING_EMULATOR");
  if (!emulator.empty()) {
    std::vector<std::string> emulatorWithArgs;
    cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
    finalCommand +=
      cmSystemTools::ConvertToRunCommandPath(emulatorWithArgs[0].c_str());
    finalCommand += " ";
    for (std::vector<std::string>::const_iterator ei =
           emulatorWithArgs.begin() + 1;
         ei != emulatorWithArgs.end(); ++ei) {
      finalCommand += "\"";
      finalCommand += *ei;
      finalCommand += "\"";
      finalCommand += " ";
    }
  }
  finalCommand +=
    cmSystemTools::ConvertToRunCommandPath(this->OutputFile.c_str());
  if (!runArgs.empty()) {
    finalCommand += runArgs;
  }
  int timeout = 0;
  bool worked = cmSystemTools::RunSingleCommand(
    finalCommand.c_str(), out, out, &retVal, CM_NULLPTR,
    cmSystemTools::OUTPUT_NONE, timeout);
  // set the run var
  char retChar[1000];
  if (worked) {
    sprintf(retChar, "%i", retVal);
  } else {
    strcpy(retChar, "FAILED_TO_RUN");
  }
  this->Makefile->AddCacheDefinition(this->RunResultVariable, retChar,
                                     "Result of TRY_RUN",
                                     cmStateEnums::INTERNAL);
}